

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::element::~element(element *this)

{
  basic_message<char> *in_RDI;
  
  booster::copy_ptr<cppcms::widgets::select_base::element::_data>::~copy_ptr
            ((copy_ptr<cppcms::widgets::select_base::element::_data> *)in_RDI);
  booster::locale::basic_message<char>::~basic_message(in_RDI);
  std::__cxx11::string::~string((string *)&(in_RDI->id_)._M_string_length);
  std::__cxx11::string::~string((string *)&in_RDI->c_id_);
  return;
}

Assistant:

select_base::element::~element()
{
}